

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_eval.cc
# Opt level: O0

base_learner * explore_eval_setup(options_i *options,vw *all)

{
  parser *ppVar1;
  undefined *puVar2;
  undefined *puVar3;
  undefined *puVar4;
  undefined *puVar5;
  undefined *puVar6;
  undefined *puVar7;
  undefined *puVar8;
  learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar9;
  byte bVar10;
  pointer peVar11;
  multi_learner *predict;
  vw *pvVar12;
  vw *in_RSI;
  learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_> *in_RDI;
  learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_> *l;
  multi_learner *base;
  option_group_definition new_options;
  bool explore_eval_option;
  free_ptr<EXPLORE_EVAL::explore_eval> data;
  typed_option<float> *in_stack_fffffffffffffad8;
  prediction_type_t pred_type;
  vw *in_stack_fffffffffffffae0;
  string *in_stack_fffffffffffffae8;
  base_learner *in_stack_fffffffffffffaf0;
  allocator *in_stack_fffffffffffffaf8;
  learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_>
  *in_stack_fffffffffffffb00;
  undefined7 in_stack_fffffffffffffb28;
  undefined1 in_stack_fffffffffffffb2f;
  option_group_definition *in_stack_fffffffffffffb30;
  allocator local_459;
  string local_458 [39];
  allocator local_431;
  string local_430 [39];
  allocator local_409;
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [32];
  undefined4 local_3c0;
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [48];
  learner<char,_char> *in_stack_fffffffffffffca0;
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  typed_option<bool> local_1e0 [2];
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [63];
  byte local_29;
  vw *local_18;
  learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_> *local_10
  ;
  base_learner *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<EXPLORE_EVAL::explore_eval>();
  local_29 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Explore evaluation",&local_89);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffae0,
             (string *)in_stack_fffffffffffffad8);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"explore_eval",&local_201);
  VW::config::make_option<bool>(in_stack_fffffffffffffae8,(bool *)in_stack_fffffffffffffae0);
  VW::config::typed_option<bool>::keep(local_1e0,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"Evaluate explore_eval adf policies",&local_229);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffffae0,(string *)in_stack_fffffffffffffad8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffffae0,
             (typed_option<bool> *)in_stack_fffffffffffffad8);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffffb30,
             (typed_option<bool> *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"multiplier",&local_391);
  std::unique_ptr<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)>::operator->
            ((unique_ptr<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)> *)0x2fcc56);
  VW::config::make_option<float>(in_stack_fffffffffffffae8,(float *)in_stack_fffffffffffffae0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3b8,"Multiplier used to make all rejection sample probabilities <= 1",&local_3b9)
  ;
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffffae0,(string *)in_stack_fffffffffffffad8);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  pred_type = (prediction_type_t)((ulong)in_stack_fffffffffffffad8 >> 0x20);
  VW::config::option_group_definition::add<float>
            (in_stack_fffffffffffffb30,
             (typed_option<float> *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffffae0);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffffae0);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffffae0);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffffae0);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  (*(code *)**(undefined8 **)local_10)(local_10,local_68);
  if ((local_29 & 1) == 0) {
    local_8 = (base_learner *)0x0;
  }
  else {
    pvVar12 = local_18;
    peVar11 = std::unique_ptr<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)>::operator->
                        ((unique_ptr<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)> *)0x2fcfea);
    plVar9 = local_10;
    peVar11->all = pvVar12;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3e0,"multiplier",&local_3e1);
    bVar10 = (**(code **)(*(long *)plVar9 + 8))(plVar9,local_3e0);
    std::__cxx11::string::~string(local_3e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
    if ((bVar10 & 1) == 0) {
      peVar11 = std::unique_ptr<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)>::operator->
                          ((unique_ptr<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)> *)0x2fd0d6);
      peVar11->multiplier = 1.0;
    }
    else {
      peVar11 = std::unique_ptr<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)>::operator->
                          ((unique_ptr<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)> *)0x2fd07a);
      peVar11->fixed_multiplier = true;
    }
    plVar9 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_408,"cb_explore_adf",&local_409);
    bVar10 = (**(code **)(*(long *)plVar9 + 8))(plVar9,local_408);
    std::__cxx11::string::~string(local_408);
    std::allocator<char>::~allocator((allocator<char> *)&local_409);
    if (((bVar10 ^ 0xff) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_430,"cb_explore_adf",&local_431);
      in_stack_fffffffffffffaf8 = &local_459;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_458,"",in_stack_fffffffffffffaf8);
      (**(code **)(*(long *)local_10 + 0x28))(local_10,local_430,local_458);
      std::__cxx11::string::~string(local_458);
      std::allocator<char>::~allocator((allocator<char> *)&local_459);
      std::__cxx11::string::~string(local_430);
      std::allocator<char>::~allocator((allocator<char> *)&local_431);
      in_stack_fffffffffffffb00 = local_10;
    }
    local_18->delete_prediction = (_func_void_void_ptr *)0x0;
    in_stack_fffffffffffffaf0 =
         setup_base((options_i *)in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
    predict = LEARNER::as_multiline<char,char>(in_stack_fffffffffffffca0);
    ppVar1 = local_18->p;
    (ppVar1->lp).label_size = DAT_004b1d98;
    puVar8 = PTR_test_label_004b1d90;
    puVar7 = PTR_weight_004b1d80;
    puVar6 = PTR_delete_label_004b1d78;
    puVar5 = PTR_read_cached_label_004b1d70;
    puVar4 = PTR_cache_label_004b1d68;
    puVar3 = PTR_parse_label_004b1d60;
    puVar2 = CB::cb_label;
    (ppVar1->lp).copy_label = (_func_void_void_ptr_void_ptr *)PTR_copy_label_004b1d88;
    (ppVar1->lp).test_label = (_func_bool_void_ptr *)puVar8;
    (ppVar1->lp).delete_label = (_func_void_void_ptr *)puVar6;
    (ppVar1->lp).get_weight = (_func_float_void_ptr *)puVar7;
    (ppVar1->lp).cache_label = (_func_void_void_ptr_io_buf_ptr *)puVar4;
    (ppVar1->lp).read_cached_label = (_func_size_t_shared_data_ptr_void_ptr_io_buf_ptr *)puVar5;
    (ppVar1->lp).default_label = (_func_void_void_ptr *)puVar2;
    (ppVar1->lp).parse_label =
         (_func_void_parser_ptr_shared_data_ptr_void_ptr_v_array<substring>_ptr *)puVar3;
    local_18->label_type = cb;
    pvVar12 = (vw *)LEARNER::
                    init_learner<EXPLORE_EVAL::explore_eval,std::vector<example*,std::allocator<example*>>,LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                              ((free_ptr<EXPLORE_EVAL::explore_eval> *)in_stack_fffffffffffffb00,
                               (learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *
                               )in_stack_fffffffffffffaf8,
                               (_func_void_explore_eval_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                                *)in_stack_fffffffffffffaf0,
                               (_func_void_explore_eval_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                                *)predict,(size_t)in_stack_fffffffffffffae0,pred_type);
    in_stack_fffffffffffffae0 = pvVar12;
    LEARNER::
    learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_>::
    set_finish_example((learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_>
                        *)pvVar12,EXPLORE_EVAL::finish_multiline_example);
    LEARNER::
    learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_>::
    set_finish(in_stack_fffffffffffffb00,(_func_void_explore_eval_ptr *)in_stack_fffffffffffffaf8);
    local_8 = LEARNER::
              make_base<EXPLORE_EVAL::explore_eval,std::vector<example*,std::allocator<example*>>>
                        ((learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_>
                          *)pvVar12);
  }
  local_3c0 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffae0);
  std::unique_ptr<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)> *)in_stack_fffffffffffffaf0);
  return local_8;
}

Assistant:

base_learner* explore_eval_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<explore_eval>();
  bool explore_eval_option = false;
  option_group_definition new_options("Explore evaluation");
  new_options.add(make_option("explore_eval", explore_eval_option).keep().help("Evaluate explore_eval adf policies"))
      .add(make_option("multiplier", data->multiplier)
               .help("Multiplier used to make all rejection sample probabilities <= 1"));
  options.add_and_parse(new_options);

  if (!explore_eval_option)
    return nullptr;

  data->all = &all;

  if (options.was_supplied("multiplier"))
    data->fixed_multiplier = true;
  else
    data->multiplier = 1;

  if (!options.was_supplied("cb_explore_adf"))
    options.insert("cb_explore_adf", "");

  all.delete_prediction = nullptr;

  multi_learner* base = as_multiline(setup_base(options, all));
  all.p->lp = CB::cb_label;
  all.label_type = label_type::cb;

  learner<explore_eval, multi_ex>& l =
      init_learner(data, base, do_actual_learning<true>, do_actual_learning<false>, 1, prediction_type::action_probs);

  l.set_finish_example(finish_multiline_example);
  l.set_finish(finish);
  return make_base(l);
}